

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O0

string * __thiscall
m2d::savanna::endpoint::build_url_str_abi_cxx11_(string *__return_storage_ptr__,endpoint *this)

{
  int iVar1;
  string local_f0 [32];
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  endpoint *local_18;
  endpoint *this_local;
  string *new_url;
  
  local_19 = 0;
  local_18 = this;
  this_local = (endpoint *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  (**this->_vptr_endpoint)(&local_60);
  std::operator+(&local_40,&local_60,"://");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  (*this->_vptr_endpoint[1])(local_90);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_90);
  std::__cxx11::string::~string(local_90);
  iVar1 = (*this->_vptr_endpoint[6])();
  if (iVar1 != 0x50) {
    iVar1 = (*this->_vptr_endpoint[6])();
    std::__cxx11::to_string(&local_d0,iVar1);
    std::operator+(&local_b0,":",&local_d0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  (*this->_vptr_endpoint[5])(local_f0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_f0);
  std::__cxx11::string::~string(local_f0);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string build_url_str()
		{
			std::string new_url;
			new_url += scheme() + "://";
			new_url += host();
			if (port() != 80) {
				new_url += ":" + std::to_string(port());
			}
			new_url += build_path();

			return new_url;
		}